

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_attributes.c
# Opt level: O2

void CGTFS_RecordFareAttributes(void)

{
  int iVar1;
  int iVar2;
  fare_attributes_t a;
  char *field_values [7];
  char *field_names [7];
  
  iVar1 = greatest_test_pre("fare_attributes_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[6] = "transfer_duration";
      field_names[4] = "transfers";
      field_names[5] = "agency_id";
      field_names[2] = "currency_type";
      field_names[3] = "payment_method";
      field_names[0] = "fare_id";
      field_names[1] = "price";
      field_values[6] = "6000";
      field_values[4] = "";
      field_values[5] = "1";
      field_values[2] = "EUR";
      field_values[3] = "0";
      field_values[0] = "17";
      field_values[1] = "2.85";
      read_fare_attributes(&a,7,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("17",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x15;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0011fa2b:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"17\" != fa_1.fare_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("EUR",a.currency_type,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x16;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fa2b;
          greatest_info.msg = "\"EUR\" != fa_1.currency_type";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t("1",a.agency_id,&greatest_type_info_string,(void *)0x0)
          ;
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x17;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fa2b;
            greatest_info.msg = "\"1\" != fa_1.agency_id";
          }
          else if ((a.price != 2.85) || (NAN(a.price))) {
            greatest_info.fail_line = 0x18;
            greatest_info.msg = "2.85 != fa_1.price";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
          else if (a.payment_method == PM_ON_BOARD) {
            if (a.transfers == TS_UNLIMITED) {
              greatest_info.assertions = greatest_info.assertions + 4;
              if ((a.transfer_duration == 6000.0) && (!NAN(a.transfer_duration))) {
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011fa48;
              }
              greatest_info.fail_line = 0x1b;
              greatest_info.msg = "6000.0 != fa_1.transfer_duration";
            }
            else {
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "TS_UNLIMITED != fa_1.transfers";
              greatest_info.assertions = greatest_info.assertions + 3;
            }
          }
          else {
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "PM_ON_BOARD != fa_1.payment_method";
            greatest_info.assertions = greatest_info.assertions + 2;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011fc6c;
    }
LAB_0011fa48:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fare_attributes_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"SOME_ID1",0xa0);
    memcpy((fare_attributes_t *)field_names,"SOME_ID1",0xa0);
    memcpy(field_values,"SOME_ID1",0xa0);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_fare_attributes(&a,(fare_attributes_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_fare_attributes(&a,(fare_attributes_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_fare_attributes
                          ((fare_attributes_t *)field_names,(fare_attributes_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0011fb4b;
        }
        greatest_info.fail_line = 0x3f;
        greatest_info.msg = "0 != equal_fare_attributes(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x3e;
        greatest_info.msg = "0 != equal_fare_attributes(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x3d;
      greatest_info.msg = "1 != equal_fare_attributes(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_0011fc6c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_0011fb4b:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFareAttributes) {
    RUN_TEST(fare_attributes_read);
    RUN_TEST(fare_attributes_compare);
}